

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_typedef(lys_module *module,lys_node *parent,unres_schema *unres)

{
  byte size;
  LYS_NODE LVar1;
  int iVar2;
  LY_ERR *pLVar3;
  uint8_t *local_40;
  uint8_t *ptr_tpdf_size;
  uint8_t tpdf_size;
  lys_tpdf *plStack_30;
  uint8_t i;
  lys_tpdf *tpdf;
  unres_schema *unres_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  if (parent == (lys_node *)0x0) {
    plStack_30 = module->tpdf;
    local_40 = &module->tpdf_size;
  }
  else {
    LVar1 = parent->nodetype;
    if (LVar1 == LYS_CONTAINER) {
      plStack_30 = (lys_tpdf *)parent[1].ref;
      local_40 = parent->padding + 3;
    }
    else if (LVar1 == LYS_LIST) {
      plStack_30 = (lys_tpdf *)parent[1].ref;
      local_40 = parent->padding + 1;
    }
    else if (LVar1 == LYS_NOTIF) {
      plStack_30 = (lys_tpdf *)parent[1].name;
      local_40 = parent->padding + 2;
    }
    else {
      if (LVar1 != LYS_RPC) {
        if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
          plStack_30 = (lys_tpdf *)parent[1].name;
          local_40 = parent->padding + 2;
          goto LAB_00174c40;
        }
        if (LVar1 == LYS_GROUPING) {
          plStack_30 = (lys_tpdf *)parent[1].name;
          local_40 = parent->padding + 3;
          goto LAB_00174c40;
        }
        if (LVar1 != LYS_ACTION) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                 ,0xdf2);
          return 1;
        }
      }
      plStack_30 = (lys_tpdf *)parent[1].name;
      local_40 = parent->padding + 3;
    }
  }
LAB_00174c40:
  size = *local_40;
  *local_40 = 0;
  ptr_tpdf_size._7_1_ = 0;
  while( true ) {
    if (size <= ptr_tpdf_size._7_1_) {
      return 0;
    }
    iVar2 = lyp_check_identifier(plStack_30[ptr_tpdf_size._7_1_].name,LY_IDENT_TYPE,module,parent);
    if ((((iVar2 != 0) ||
         (iVar2 = yang_fill_type(module,&plStack_30[ptr_tpdf_size._7_1_].type,
                                 (yang_type *)plStack_30[ptr_tpdf_size._7_1_].type.der,
                                 plStack_30 + ptr_tpdf_size._7_1_,unres), iVar2 != 0)) ||
        (iVar2 = yang_check_ext_instance
                           (module,&plStack_30[ptr_tpdf_size._7_1_].ext,
                            (uint)plStack_30[ptr_tpdf_size._7_1_].ext_size,
                            plStack_30 + ptr_tpdf_size._7_1_,unres), iVar2 != 0)) ||
       (iVar2 = unres_schema_add_node
                          (module,unres,&plStack_30[ptr_tpdf_size._7_1_].type,UNRES_TYPE_DER_TPDF,
                           parent), iVar2 == -1)) break;
    *local_40 = *local_40 + 1;
    iVar2 = unres_schema_add_node
                      (module,unres,&plStack_30[ptr_tpdf_size._7_1_].type,UNRES_TYPEDEF_DFLT,
                       (lys_node *)&plStack_30[ptr_tpdf_size._7_1_].dflt);
    if (iVar2 == -1) {
      ptr_tpdf_size._7_1_ = ptr_tpdf_size._7_1_ + 1;
      break;
    }
    ptr_tpdf_size._7_1_ = ptr_tpdf_size._7_1_ + 1;
  }
  yang_tpdf_free(module->ctx,plStack_30,ptr_tpdf_size._7_1_,size);
  return 1;
}

Assistant:

int
yang_check_typedef(struct lys_module *module, struct lys_node *parent, struct unres_schema *unres)
{
    struct lys_tpdf *tpdf;
    uint8_t i, tpdf_size, *ptr_tpdf_size;

    if (!parent) {
        tpdf = module->tpdf;
        ptr_tpdf_size = &module->tpdf_size;
    } else {
        switch (parent->nodetype) {
        case LYS_GROUPING:
            tpdf = ((struct lys_node_grp *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_grp *)parent)->tpdf_size;
            break;
        case LYS_CONTAINER:
            tpdf = ((struct lys_node_container *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_container *)parent)->tpdf_size;
            break;
        case LYS_LIST:
            tpdf = ((struct lys_node_list *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_list *)parent)->tpdf_size;
            break;
        case LYS_RPC:
        case LYS_ACTION:
            tpdf = ((struct lys_node_rpc_action *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_rpc_action *)parent)->tpdf_size;
            break;
        case LYS_INPUT:
        case LYS_OUTPUT:
            tpdf = ((struct lys_node_inout *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_inout *)parent)->tpdf_size;
            break;
        case LYS_NOTIF:
            tpdf = ((struct lys_node_notif *)parent)->tpdf;
            ptr_tpdf_size = &((struct lys_node_notif *)parent)->tpdf_size;
            break;
        default:
            LOGINT;
            return EXIT_FAILURE;
        }
    }

    tpdf_size = *ptr_tpdf_size;
    *ptr_tpdf_size = 0;

    for (i = 0; i < tpdf_size; ++i) {
        if (lyp_check_identifier(tpdf[i].name, LY_IDENT_TYPE, module, parent)) {
            goto error;
        }

        if (yang_fill_type(module, &tpdf[i].type, (struct yang_type *)tpdf[i].type.der, &tpdf[i], unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &tpdf[i].ext, tpdf[i].ext_size, &tpdf[i], unres)) {
            goto error;
        }
        if (unres_schema_add_node(module, unres, &tpdf[i].type, UNRES_TYPE_DER_TPDF, parent) == -1) {
            goto error;
        }

        (*ptr_tpdf_size)++;
        /* check default value*/
        if (unres_schema_add_node(module, unres, &tpdf[i].type, UNRES_TYPEDEF_DFLT,
                                  (struct lys_node *)(&tpdf[i].dflt)) == -1)  {
            ++i;
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    yang_tpdf_free(module->ctx, tpdf, i, tpdf_size);
    return EXIT_FAILURE;
}